

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_GetPegoutPubkeyDataPkhNoCounterTest_Test::TestBody
          (ConfidentialTransaction_GetPegoutPubkeyDataPkhNoCounterTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_468;
  Message local_460;
  string local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_2;
  Message local_420;
  string local_418;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_1;
  Message local_3e0;
  string local_3d8;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar;
  Message local_3a0 [2];
  PegoutKeyData local_390;
  undefined1 local_35d;
  undefined1 local_35c;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  undefined1 local_358 [8];
  GetPegoutPubkeyDataTestVector testdata;
  Address addr;
  PegoutKeyData key_data;
  uint32_t bip32_counter;
  undefined1 local_128 [8];
  ByteData pubkey_prefix;
  NetType net_type;
  undefined1 local_e8 [8];
  ByteData whitelist;
  undefined1 local_c8 [8];
  string bitcoin_descriptor;
  string local_a0;
  undefined1 local_80 [8];
  Privkey master_online_key;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  Pubkey online_pubkey;
  ConfidentialTransaction_GetPegoutPubkeyDataPkhNoCounterTest_Test *this_local;
  
  online_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da",&local_49);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN",
             (allocator *)(bitcoin_descriptor.field_2._M_local_buf + 0xf));
  cfd::core::Privkey::FromWif((Privkey *)local_80,&local_a0,kTestnet,true);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(bitcoin_descriptor.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_c8,
             "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz"
             ,(allocator *)
              ((long)&whitelist.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&whitelist.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&net_type,
             "020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da"
             ,(allocator *)
              ((long)&pubkey_prefix.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_e8,(string *)&net_type);
  std::__cxx11::string::~string((string *)&net_type);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pubkey_prefix.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  pubkey_prefix.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = kTestnet;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&bip32_counter,"043587cf",
             (allocator *)
             ((long)&key_data.whitelist_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_128,(string *)&bip32_counter);
  std::__cxx11::string::~string((string *)&bip32_counter);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key_data.whitelist_proof.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  key_data.whitelist_proof.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  cfd::core::PegoutKeyData::PegoutKeyData
            ((PegoutKeyData *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address((Address *)((long)&testdata.address.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_358,
             "031edbc17e3c1e67bb7d4aaceede0b78e5b4bd69d1b38b1a7048f605d96f572ef1",&local_359);
  local_35d = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(testdata.btc_pubkey_bytes.field_2._M_local_buf + 8),
             "01cac9aebddceb0cc8e869f43d080ab00895ce89c3127c85ffd221152c52d912134d7d3da862e36b66c63f39bb4e1920bcd74013ec9a97e3374678113251f6a12d"
             ,&local_35a);
  local_35c = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(testdata.whitelist_proof.field_2._M_local_buf + 8),
             "mx7egZtzUWR8aVviQnpKJCoaT4ytSiQjxL",&local_35b);
  local_35c = 0;
  local_35d = 0;
  std::allocator<char>::~allocator((allocator<char> *)&local_35b);
  std::allocator<char>::~allocator((allocator<char> *)&local_35a);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                (&local_390,(Pubkey *)local_28,(Privkey *)local_80,(string *)local_c8,
                 (uint32_t)
                 key_data.whitelist_proof.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(ByteData *)local_e8,
                 (NetType)pubkey_prefix.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(ByteData *)local_128,
                 kElementsRegtest,(Address *)((long)&testdata.address.field_2 + 8));
      cfd::core::PegoutKeyData::operator=
                ((PegoutKeyData *)
                 &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_390
                );
      cfd::core::PegoutKeyData::~PegoutKeyData(&local_390);
    }
  }
  else {
    testing::Message::Message(local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7b5,
               "Expected: (key_data = ConfidentialTransaction::GetPegoutPubkeyData( online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter, whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_3a0);
  }
  cfd::core::Pubkey::GetHex_abi_cxx11_
            (&local_3d8,
             (Pubkey *)&addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3b8,"key_data.btc_pubkey_bytes.GetHex().c_str()",
             "testdata.btc_pubkey_bytes.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7b8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_418,
             (ByteData *)
             ((long)&key_data.btc_pubkey_bytes.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3f8,"key_data.whitelist_proof.GetHex().c_str()",
             "testdata.whitelist_proof.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_418);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_420);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7bb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  cfd::core::Address::GetAddress_abi_cxx11_
            (&local_458,(Address *)((long)&testdata.address.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_438,"addr.GetAddress().c_str()","testdata.address.c_str()",pcVar2,
             pcVar3);
  std::__cxx11::string::~string((string *)&local_458);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  GetPegoutPubkeyDataTestVector::~GetPegoutPubkeyDataTestVector
            ((GetPegoutPubkeyDataTestVector *)local_358);
  cfd::core::Address::~Address((Address *)((long)&testdata.address.field_2 + 8));
  cfd::core::PegoutKeyData::~PegoutKeyData
            ((PegoutKeyData *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::ByteData::~ByteData((ByteData *)local_128);
  cfd::core::ByteData::~ByteData((ByteData *)local_e8);
  std::__cxx11::string::~string((string *)local_c8);
  cfd::core::Privkey::~Privkey((Privkey *)local_80);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_28);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetPegoutPubkeyDataPkhNoCounterTest) {
  // liquid_pak
  Pubkey online_pubkey("02a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  // liquid_pak_privkey
  Privkey master_online_key = Privkey::FromWif(
      "cPoefvB147bYpWCf9JqRBVMXENt4isSBAn91RYeiBh1jUp3ThhKN", NetType::kTestnet, true);
  std::string bitcoin_descriptor = "tpubDBwZbsX7C1m4tfHxHSFBvvuasqMxzMvSNM5yuAWz6kAfCATAgegvrtGdnxkqfr8wwRZi5d9fJHXqE8EFTSogTXd3xVx3GUFy9Xcg8dufREz";
  ByteData whitelist("020061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c002a71e193ce21075d0966be16724e41fff666366d7ac13e3616a329005da4024da");
  NetType net_type = NetType::kTestnet;
  ByteData pubkey_prefix = ByteData("043587cf");
  uint32_t bip32_counter = 0;
  PegoutKeyData key_data;

  Address addr;
  // 20200625: Although the logic is the same, a problem occurred due to the processing position.
  GetPegoutPubkeyDataTestVector testdata = {
    "031edbc17e3c1e67bb7d4aaceede0b78e5b4bd69d1b38b1a7048f605d96f572ef1",
    "01cac9aebddceb0cc8e869f43d080ab00895ce89c3127c85ffd221152c52d912134d7d3da862e36b66c63f39bb4e1920bcd74013ec9a97e3374678113251f6a12d",
    "mx7egZtzUWR8aVviQnpKJCoaT4ytSiQjxL"
  };
  EXPECT_NO_THROW(
    (key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, bitcoin_descriptor, bip32_counter,
        whitelist, net_type, pubkey_prefix, NetType::kElementsRegtest, &addr)));
  EXPECT_STREQ(
      key_data.btc_pubkey_bytes.GetHex().c_str(),
      testdata.btc_pubkey_bytes.c_str());
  EXPECT_STREQ(
      key_data.whitelist_proof.GetHex().c_str(),
      testdata.whitelist_proof.c_str());
  EXPECT_STREQ(
      addr.GetAddress().c_str(),
      testdata.address.c_str());
}